

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

bool absl::lts_20250127::container_internal::anon_unknown_2::ShouldRehashForBugDetection
               (ctrl_t *ctrl,size_t capacity)

{
  size_t sVar1;
  size_t sVar2;
  size_t local_38;
  probe_seq<16UL> local_30;
  size_t local_18;
  size_t capacity_local;
  ctrl_t *ctrl_local;
  
  local_18 = capacity;
  capacity_local = (size_t)ctrl;
  local_38 = RandomSeed();
  sVar1 = HashOf<unsigned_long>(&local_38);
  probe(&local_30,ctrl,capacity,sVar1);
  sVar1 = probe_seq<16UL>::offset(&local_30);
  sVar2 = RehashProbabilityConstant();
  return sVar1 < sVar2;
}

Assistant:

bool ShouldRehashForBugDetection(const ctrl_t* ctrl, size_t capacity) {
  // Note: we can't use the abseil-random library because abseil-random
  // depends on swisstable. We want to return true with probability
  // `min(1, RehashProbabilityConstant() / capacity())`. In order to do this,
  // we probe based on a random hash and see if the offset is less than
  // RehashProbabilityConstant().
  return probe(ctrl, capacity, absl::HashOf(RandomSeed())).offset() <
         RehashProbabilityConstant();
}